

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.h
# Opt level: O2

void __thiscall
argParserAdvancedConfiguration::argument::argument
          (argument *this,string *argS,string *argL,string *helpMessage,
          function<int_(int,_char_**)> *callBack_)

{
  allocator local_31;
  
  std::__cxx11::string::string((string *)this,(string *)argS);
  std::__cxx11::string::string((string *)&this->argLong,(string *)argL);
  std::__cxx11::string::string((string *)&this->helpMessage,(string *)helpMessage);
  std::__cxx11::string::string((string *)&this->additionalHelp,"",&local_31);
  (this->enums)._M_dataplus._M_p = (pointer)&(this->enums).field_2;
  (this->enums)._M_string_length = 0;
  (this->enums).field_2._M_local_buf[0] = '\0';
  std::function<int_(int,_char_**)>::function(&this->callBack,callBack_);
  (this->simpleCallBack).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->simpleCallBack)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->simpleCallBack).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->simpleCallBack).super__Function_base._M_functor + 8) = 0;
  this->requiredAndNotHitJet = false;
  this->numberOfArguments = -1;
  return;
}

Assistant:

argument(string argS, string argL, string helpMessage, function<int(int, char **)> callBack_) : argLong(
                std::move(argL)), argShort(std::move(argS)), callBack(callBack_), helpMessage(
                std::move(helpMessage)) {}